

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O3

void Image_Function::Rotate
               (Image *in,uint32_t startXIn,uint32_t startYIn,double centerXIn,double centerYIn,
               Image *out,uint32_t startXOut,uint32_t startYOut,double centerXOut,double centerYOut,
               uint32_t width,uint32_t height,double angle)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  uchar *puVar12;
  EVP_PKEY_CTX *src;
  uchar uVar13;
  uint uVar14;
  uchar *puVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  double dVar20;
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 in_ZMM7 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 in_XMM16 [16];
  ImageTemplate<unsigned_char> local_58;
  undefined1 extraout_var [56];
  
  auVar25 = in_ZMM7._0_16_;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_0011ac30;
  local_58._data = (uchar *)0x0;
  local_58._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)out,src);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(&local_58);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_0011ac30;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  dVar20 = cos(angle);
  auVar21._0_8_ = sin(angle);
  auVar21._8_56_ = extraout_var;
  uVar1 = out->_rowSize;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar20;
  if (uVar1 * height != 0) {
    auVar24._8_8_ = 0;
    auVar24._0_8_ = centerXOut;
    uVar2 = in->_rowSize;
    puVar3 = in->_data;
    auVar11 = vcvtusi2sd_avx512f(auVar25,startXIn);
    auVar25 = vcvtusi2sd_avx512f(auVar25,startYIn);
    puVar15 = out->_data + (ulong)startXOut + (ulong)(startYOut * uVar1);
    puVar12 = puVar15 + uVar1 * height;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar20 * centerYOut;
    auVar22 = vfnmadd231sd_fma(auVar22,auVar21._0_16_,auVar24);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = auVar21._0_8_ * centerYOut;
    auVar34 = vfmadd231sd_fma(auVar23,auVar34,auVar24);
    dVar5 = centerYIn - auVar22._0_8_;
    dVar6 = centerXIn - auVar34._0_8_;
    do {
      if (width != 0) {
        uVar16 = 0;
        dVar4 = dVar6;
        dVar10 = dVar5;
        do {
          uVar13 = '\0';
          if ((auVar11._0_8_ <= dVar4) && (auVar25._0_8_ <= dVar10)) {
            auVar26._8_8_ = 0;
            auVar26._0_8_ = dVar4;
            uVar18 = vcvttsd2usi_avx512f(auVar26);
            uVar13 = '\0';
            if ((uVar18 < (startXIn - 1) + width) &&
               (auVar27._8_8_ = 0, auVar27._0_8_ = dVar10, uVar19 = vcvttsd2usi_avx512f(auVar27),
               uVar13 = '\0', uVar19 < (startYIn - 1) + height)) {
              uVar14 = uVar2 * uVar19;
              auVar34 = vcvtusi2sd_avx512f(in_XMM16,uVar18);
              uVar17 = (ulong)uVar18;
              auVar22 = vcvtusi2sd_avx512f(in_XMM16,uVar19);
              dVar7 = dVar4 - auVar34._0_8_;
              dVar8 = dVar10 - auVar22._0_8_;
              dVar9 = 1.0 - dVar8;
              auVar34 = vcvtsi2sd_avx512f(in_XMM16,(uint)puVar3[uVar17 + 1 + (ulong)uVar14]);
              auVar22 = vcvtsi2sd_avx512f(in_XMM16,(uint)puVar3[uVar17 + uVar14]);
              auVar30._8_8_ = 0;
              auVar30._0_8_ = (1.0 - dVar7) * auVar22._0_8_;
              auVar32._8_8_ = 0;
              auVar32._0_8_ = dVar9;
              auVar33._8_8_ = 0;
              auVar33._0_8_ = dVar9 * dVar7 * auVar34._0_8_;
              auVar23 = vfmadd231sd_fma(auVar33,auVar32,auVar30);
              auVar34 = vcvtsi2sd_avx512f(in_XMM16,(uint)puVar3[(ulong)uVar2 + uVar17 + uVar14]);
              auVar22 = vcvtsi2sd_avx512f(in_XMM16,(uint)puVar3[(ulong)uVar2 + 1 + uVar17 + uVar14])
              ;
              auVar29._8_8_ = 0;
              auVar29._0_8_ = dVar8;
              auVar31._8_8_ = 0;
              auVar31._0_8_ = (1.0 - dVar7) * auVar34._0_8_;
              auVar34 = vfmadd213sd_fma(auVar31,auVar29,auVar23);
              auVar28._8_8_ = 0;
              auVar28._0_8_ = dVar7 * auVar22._0_8_;
              auVar34 = vfmadd213sd_fma(auVar28,auVar29,auVar34);
              uVar13 = (uchar)(int)(auVar34._0_8_ + 0.5);
            }
          }
          dVar4 = dVar20 + dVar4;
          dVar10 = dVar10 - auVar21._0_8_;
          puVar15[uVar16] = uVar13;
          uVar16 = uVar16 + 1;
        } while (width != uVar16);
      }
      dVar6 = auVar21._0_8_ + dVar6;
      dVar5 = dVar20 + dVar5;
      puVar15 = puVar15 + uVar1;
    } while (puVar15 != puVar12);
  }
  return;
}

Assistant:

void Rotate( const Image & in, uint32_t startXIn, uint32_t startYIn, double centerXIn, double centerYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                 double centerXOut, double centerYOut, uint32_t width, uint32_t height, double angle )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( in, out );

        const double cosAngle = cos( angle );
        const double sinAngle = sin( angle );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data();
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;
        const uint8_t * outYEnd = outY + height * rowSizeOut;

        double inXPos = -(cosAngle * centerXOut + sinAngle * centerYOut) + centerXIn;
        double inYPos = -(-sinAngle * centerXOut + cosAngle * centerYOut) + centerYIn;

        const double minX = startXIn;
        const double minY = startYIn;
        const uint32_t maxX = startXIn + width - 1u;
        const uint32_t maxY = startYIn + height - 1u;

        for( ; outY != outYEnd; outY += rowSizeOut, inXPos += sinAngle, inYPos += cosAngle ) {
            uint8_t       * outX = outY;
            const uint8_t * outXEnd = outX + width;

            double posX = inXPos;
            double posY = inYPos;

            for( ; outX != outXEnd; ++outX, posX += cosAngle, posY -= sinAngle ) {
                if( posX < minX || posY < minY ) {
                    (*outX) = 0; // we actually do not know what is beyond an image so we set value 0
                }
                else {
                    const uint32_t x = static_cast<uint32_t>(posX);
                    const uint32_t y = static_cast<uint32_t>(posY);

                    if( x >= maxX || y >= maxY ) {
                        (*outX) = 0; // we actually do not know what is beyond an image so we set value 0
                    }
                    else {
                        const uint8_t * inX = inY + y * rowSizeIn + x;

                        // we use bilinear approximation to find pixel intensity value
                        const double coeffX = posX - x;
                        const double coeffY = posY - y;

                        // Take a weighted mean of four pixels. Use offset of 0.5
                        // so that integer conversion leads to rounding instead of 
                        // simple truncation.
                        const double sum = *(inX) * (1 - coeffX) * (1 - coeffY) + *(inX + 1) * (coeffX) * (1 - coeffY) +
                                           *(inX + rowSizeIn) * (1 - coeffX) * (coeffY) + *(inX + rowSizeIn + 1) * (coeffX) * (coeffY) + 0.5;

                        (*outX) = static_cast<uint8_t>(sum);
                    }
                }
            }
        }
    }